

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O3

int __thiscall
RuntimeObjectSystem::TestBuildAllRuntimeSourceFiles
          (RuntimeObjectSystem *this,ITestBuildNotifier *callback,bool bTestFileTracking)

{
  ICompilerLogger *pIVar1;
  int iVar2;
  pointer pPVar3;
  int iVar4;
  pointer pPVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  pointer *ppPVar9;
  uint uVar10;
  long lVar11;
  ushort uVar12;
  pointer this_00;
  TFileList filesToTest;
  vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> local_68;
  string local_50;
  
  pIVar1 = this->m_pCompilerLogger;
  if (pIVar1 != (ICompilerLogger *)0x0) {
    (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,"TestBuildAllRuntimeSourceFiles Starting\n");
  }
  if (callback == (ITestBuildNotifier *)0x0) {
    callback = (ITestBuildNotifier *)this;
  }
  pPVar3 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pPVar5 - (long)pPVar3 != 0) {
    uVar6 = ((long)pPVar5 - (long)pPVar3 >> 3) * -0x7dc11f7047dc11f7;
    ppPVar9 = &(pPVar3->m_RuntimeFileList).
               super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    uVar12 = 1;
    lVar11 = 0;
    do {
      lVar11 = lVar11 + ((long)*ppPVar9 - (long)((_Vector_impl_data *)(ppPVar9 + -1))->_M_start >> 3
                        ) * -0x3333333333333333;
      uVar7 = (ulong)uVar12;
      ppPVar9 = ppPVar9 + 0x39;
      uVar12 = uVar12 + 1;
    } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
    if (lVar11 != 0) goto LAB_0010f5fa;
  }
  (*(((RuntimeObjectSystem *)callback)->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
    _vptr_ITestBuildNotifier[2])(callback,0,1);
  pPVar3 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_0010f5fa:
  if (pPVar5 != pPVar3) {
    uVar6 = 0;
    uVar10 = 0;
    iVar8 = 0;
    do {
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::vector
                (&local_68,&pPVar3[uVar6].m_RuntimeFileList);
      for (this_00 = local_68.
                     super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          this_00 !=
          local_68.super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
          ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
        FileSystemUtils::Path::Extension_abi_cxx11_(&local_50,this_00);
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar2 != 0) {
          iVar2 = TestBuildFile(this->m_pCompilerLogger,this,this_00,callback,bTestFileTracking);
          if (iVar2 < 0) {
            iVar4 = 0;
            if (iVar2 != -0xd1e) {
              iVar4 = iVar2;
            }
            std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector
                      (&local_68);
            return iVar8 - iVar4;
          }
          iVar8 = iVar8 + iVar2;
        }
      }
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector(&local_68)
      ;
      uVar10 = uVar10 + 1;
      uVar6 = (ulong)(uVar10 & 0xffff);
      pPVar3 = (this->m_Projects).
               super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->m_Projects).
                     super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
              -0x7dc11f7047dc11f7;
    } while (uVar6 <= uVar7 && uVar7 - uVar6 != 0);
    if (iVar8 != 0) {
      pIVar1 = this->m_pCompilerLogger;
      if (pIVar1 != (ICompilerLogger *)0x0) {
        (*(code *)**(undefined8 **)pIVar1)(pIVar1,"Tests Failed: %d\n",iVar8);
        return iVar8;
      }
      return iVar8;
    }
  }
  pIVar1 = this->m_pCompilerLogger;
  if (pIVar1 != (ICompilerLogger *)0x0) {
    (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,"All Tests Passed\n");
  }
  return 0;
}

Assistant:

int RuntimeObjectSystem::TestBuildAllRuntimeSourceFiles(  ITestBuildNotifier* callback, bool bTestFileTracking )
{
    if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("TestBuildAllRuntimeSourceFiles Starting\n"); }
   
    ITestBuildNotifier* failCallbackLocal = callback;
    if( !failCallbackLocal )
    {
        failCallbackLocal = this;
    }

    int numErrors = 0;

    size_t numFilesToBuild = 0;
    for( unsigned short proj = 0; proj < m_Projects.size( ); ++proj )
    {
        numFilesToBuild += m_Projects[ proj ].m_RuntimeFileList.size( );
    }

    if( 0 == numFilesToBuild )
    {
        failCallbackLocal->TestBuildCallback( NULL, TESTBUILDRRESULT_NO_FILES_TO_BUILD );
    }
    
    for( unsigned short proj = 0; proj < m_Projects.size(); ++proj )
    {
        TFileList filesToTest = m_Projects[ proj ].m_RuntimeFileList; // m_RuntimeFileList could change if file content changes (new includes or source dependencies) so make copy to ensure iterators valid.
        for( TFileList::iterator it = filesToTest.begin(); it != filesToTest.end(); ++it )
        {
            const Path& file = *it;
            if( file.Extension() != ".h" ) // exclude headers, use TestBuildAllRuntimeHeaders
            {
                int fileErrors = TestBuildFile( m_pCompilerLogger, this, file, failCallbackLocal, bTestFileTracking );
                if( fileErrors < 0 )
                {
                    // this means exit, and the number of errors is -ve so remove, unless -0xD1E is the response (for no error die)
                    if( fileErrors != -0xD1E )
                    {
                        numErrors -= fileErrors;
                    }
                    return numErrors;
                }
                numErrors += fileErrors;
            }
        }
    }

    if( 0 == numErrors )
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("All Tests Passed\n"); }
    }
    else
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("Tests Failed: %d\n", numErrors); }
    }
    return numErrors;
}